

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall FpgaIO::PromReadData(FpgaIO *this,uint32_t addr,uint8_t *data,uint nbytes)

{
  BasePort *pBVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  ostream *poVar5;
  void *pvVar6;
  int local_6c;
  undefined8 local_60;
  nodeaddr_t address;
  uint local_50;
  uint32_t fver;
  uint32_t nRead;
  int MAX_LOOP_CNT;
  int i;
  quadlet_t read_data;
  uint bytesToRead;
  uint maxReadSize;
  uint32_t page;
  quadlet_t write_data;
  uint32_t addr24;
  uint nbytes_local;
  uint8_t *data_local;
  FpgaIO *pFStack_18;
  uint32_t addr_local;
  FpgaIO *this_local;
  
  page = addr & 0xffffff;
  if (page + nbytes < 0x1000000) {
    maxReadSize = page | 0x3000000;
    write_data = nbytes;
    _addr24 = data;
    data_local._4_4_ = addr;
    pFStack_18 = this;
    for (bytesToRead = 0; bytesToRead < write_data; bytesToRead = i + bytesToRead) {
      read_data = 0x40;
      if (write_data - bytesToRead < 0x40) {
        local_6c = write_data - bytesToRead;
      }
      else {
        local_6c = 0x40;
      }
      i = local_6c;
      pBVar1 = (this->super_BoardIO).port;
      uVar3 = (*pBVar1->_vptr_BasePort[0x24])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,(ulong)maxReadSize);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      MAX_LOOP_CNT = 7;
      fver = 8;
      for (nRead = 0; (int)nRead < 8 && MAX_LOOP_CNT != 0; nRead = nRead + 1) {
        Amp1394_Sleep(1e-05);
        pBVar1 = (this->super_BoardIO).port;
        uVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&MAX_LOOP_CNT);
        if ((uVar3 & 1) == 0) {
          return false;
        }
        MAX_LOOP_CNT = MAX_LOOP_CNT & 7;
      }
      if (nRead == 8) {
        poVar5 = std::operator<<((ostream *)&std::cout,
                                 "PromReadData: command failed to finish, status = ");
        pvVar6 = (void *)std::ostream::operator<<(poVar5,std::hex);
        pvVar6 = (void *)std::ostream::operator<<(pvVar6,MAX_LOOP_CNT);
        pvVar6 = (void *)std::ostream::operator<<(pvVar6,std::dec);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        return false;
      }
      bVar2 = PromGetResult(this,&local_50,PROM_M25P16);
      if (!bVar2) {
        poVar5 = std::operator<<((ostream *)&std::cout,"PromReadData: failed to get PROM result");
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        return false;
      }
      local_50 = local_50 << 2;
      if (local_50 != 0x100) {
        poVar5 = std::operator<<((ostream *)&std::cout,"PromReadData: incorrect number of bytes = ")
        ;
        pvVar6 = (void *)std::ostream::operator<<(poVar5,local_50);
        std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
        return false;
      }
      uVar4 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
      if (uVar4 < 4) {
        local_60 = 0xc0;
      }
      else {
        local_60 = 0x2000;
      }
      pBVar1 = (this->super_BoardIO).port;
      uVar3 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,local_60,_addr24 + bytesToRead,
                         (ulong)(uint)i);
      if ((uVar3 & 1) == 0) {
        return false;
      }
      maxReadSize = i + maxReadSize;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::PromReadData(uint32_t addr, uint8_t *data,
                         unsigned int nbytes)
{
    uint32_t addr24 = addr&0x00ffffff;
    if (addr24+nbytes > 0x00ffffff)
        return false;
    quadlet_t write_data = 0x03000000|addr24;  // 03h = Read Data Bytes
    uint32_t page = 0;
    while (page < nbytes) {
        const unsigned int maxReadSize = 64u;
        unsigned int bytesToRead = ((nbytes-page)<maxReadSize) ? (nbytes-page) : maxReadSize;
        if (!port->WriteQuadlet(BoardId, 0x08, write_data))
            return false;
        // Read FPGA status register; if 3 LSB are 0, command has finished.
        // The IEEE-1394 clock is 24.576 MHz, so it should take
        // about 256*8*(1/24.576) = 83.3 microseconds to read 256 bytes.
        // Experimentally, 1 iteration of the loop below is sufficient
        // most of the time, with 2 iterations required occasionally.
        quadlet_t read_data = 0x0007;
        int i;
        const int MAX_LOOP_CNT = 8;
        for (i = 0; (i < MAX_LOOP_CNT) && read_data; i++) {
            Amp1394_Sleep(0.00001);   // 10 usec
            if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return false;
            read_data = read_data&0x0007;
        }
        if (i == MAX_LOOP_CNT) {
            std::cout << "PromReadData: command failed to finish, status = "
                      << std::hex << read_data << std::dec << std::endl;
            return false;
        }
        // Now, read result. This should be the number of quadlets read.
        uint32_t nRead;
        if (!PromGetResult(nRead)) {
            std::cout << "PromReadData: failed to get PROM result" << std::endl;
            return false;
        }
        nRead *= 4;
        // should never happen, as for now firmware always reads 256 bytes
        // and saves to local registers in FPGA
        if (nRead != 256) {
            std::cout << "PromReadData: incorrect number of bytes = "
                      << nRead << std::endl;
            return false;
        }

        uint32_t fver = GetFirmwareVersion();
        nodeaddr_t address;
        if (fver >= 4) {address = 0x2000;}
        else {address = 0xc0;}
        if (!port->ReadBlock(BoardId, address, (quadlet_t *)(data+page), bytesToRead))
            return false;
        write_data += bytesToRead;
        page += bytesToRead;
    }
    return true;
}